

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O1

void __thiscall util_tests::test_SplitString::test_method(test_SplitString *this)

{
  int iVar1;
  pointer pbVar2;
  long *plVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  long *plVar7;
  long lVar8;
  long *plVar9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  const_string file_16;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  const_string file_17;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  const_string file_18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  const_string file_19;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  const_string file_20;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  const_string file_21;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  const_string file_22;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  string_view separators;
  string_view separators_00;
  string_view separators_01;
  string_view separators_02;
  string_view separators_03;
  string_view separators_04;
  string_view separators_05;
  string_view separators_06;
  string_view separators_07;
  string_view separators_08;
  string_view separators_09;
  string_view separators_10;
  string_view separators_11;
  string_view separators_12;
  check_type cVar10;
  char *local_588;
  char *local_580;
  undefined1 *local_578;
  undefined1 *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  undefined1 *local_548;
  undefined1 *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  undefined1 local_4e8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result;
  allocator_type local_4a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  undefined1 local_488 [16];
  pointer local_478;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3a8;
  assertion_result local_388;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  assertion_result local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  undefined1 local_128 [24];
  undefined1 local_110 [8];
  pointer apbStack_108 [2];
  undefined1 local_f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  long local_d8 [2];
  long *local_c8 [2];
  long local_b8 [2];
  long *local_a8 [2];
  long local_98 [2];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_68;
  lazy_ostream local_58;
  _func_int *local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_128._0_8_ = "";
  local_128._8_8_ = (pointer)0x0;
  local_88[0] = 0x2d;
  separators._M_str = in_R8;
  separators._M_len = (size_t)local_88;
  util::Split<std::__cxx11::string>(&result,(util *)local_128,(Span<const_char> *)0x1,separators);
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x594;
  file.m_begin = (iterator)&local_158;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_168,msg);
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_48 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_40 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0xf6cf21;
  local_4a8._M_dataplus._M_p =
       (pointer)((long)result.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)result.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = &local_4a8;
  local_488._0_8_ = local_4e8;
  local_4e8._0_4_ = 1;
  local_148.m_message.px = (element_type *)0x0;
  local_148.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_388._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_388.m_message.px = (element_type *)0xf6c42b;
  local_110 = (undefined1  [8])&local_3a8;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_013abb70;
  local_128._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._8_8_ = local_488;
  local_88._8_8_ = local_88._8_8_ & 0xffffffffffffff00;
  local_88._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_78._0_8_ = boost::unit_test::lazy_ostream::inst;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((long)result.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)result.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x20);
  boost::test_tools::tt_detail::report_assertion
            (&local_148,&local_58,1,2,REQUIRE,0xf731c7,(size_t)&local_388,0x594,(util *)local_128,
             "1",local_88);
  boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x595;
  file_00.m_begin = (iterator)&local_178;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_188,
             msg_00);
  pbVar2 = result.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_48 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_40 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0xf6cf21;
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (result.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,"");
  local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == 0);
  local_148.m_message.px = (element_type *)0x0;
  local_148.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_388._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_388.m_message.px = (element_type *)0xf6c42b;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pbVar2;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_128._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_110 = (undefined1  [8])&local_3a8;
  local_488._0_8_ = "";
  local_88._8_8_ = local_88._8_8_ & 0xffffffffffffff00;
  local_88._0_8_ = &PTR__lazy_ostream_013ac170;
  local_78._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._8_8_ = local_488;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_148,&local_58,1,2,REQUIRE,0xec2cf6,(size_t)&local_388,0x595,local_128,"\"\"",
             local_88);
  boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&result);
  local_128._0_8_ = "-";
  local_128._8_8_ = (pointer)0x1;
  local_88[0] = 0x2d;
  separators_00._M_str = pvVar4;
  separators_00._M_len = (size_t)local_88;
  util::Split<std::__cxx11::string>(&result,(util *)local_128,(Span<const_char> *)0x1,separators_00)
  ;
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x59b;
  file_01.m_begin = (iterator)&local_198;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1a8,
             msg_01);
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_48 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_40 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0xf6cf21;
  local_4a8._M_dataplus._M_p =
       (pointer)((long)result.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)result.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
  local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((long)result.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)result.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x40);
  local_4e8._0_4_ = 2;
  local_148.m_message.px = (element_type *)0x0;
  local_148.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_388._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_388.m_message.px = (element_type *)0xf6c42b;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = &local_4a8;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_013abb70;
  local_128._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_110 = (undefined1  [8])&local_3a8;
  local_488._0_8_ = local_4e8;
  local_88._8_8_ = local_88._8_8_ & 0xffffffffffffff00;
  local_88._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_78._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._8_8_ = local_488;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_148,&local_58,1,2,REQUIRE,0xf731c7,(size_t)&local_388,0x59b,(util *)local_128,
             "2",local_88);
  boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x59c;
  file_02.m_begin = (iterator)&local_1b8;
  msg_02.m_end = pvVar5;
  msg_02.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1c8,
             msg_02);
  pbVar2 = result.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_48 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_40 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0xf6cf21;
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (result.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,"");
  local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == 0);
  local_148.m_message.px = (element_type *)0x0;
  local_148.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_388._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_388.m_message.px = (element_type *)0xf6c42b;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pbVar2;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_128._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_110 = (undefined1  [8])&local_3a8;
  local_488._0_8_ = "";
  local_88._8_8_ = local_88._8_8_ & 0xffffffffffffff00;
  local_88._0_8_ = &PTR__lazy_ostream_013ac170;
  local_78._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._8_8_ = local_488;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_148,&local_58,1,2,REQUIRE,0xec2cf6,(size_t)&local_388,0x59c,local_128,"\"\"",
             local_88);
  boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x59d;
  file_03.m_begin = (iterator)&local_1d8;
  msg_03.m_end = pvVar5;
  msg_03.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1e8,
             msg_03);
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_48 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_40 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0xf6cf21;
  pbVar6 = result.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1;
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (pbVar6,"");
  local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == 0);
  local_148.m_message.px = (element_type *)0x0;
  local_148.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_388._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_388.m_message.px = (element_type *)0xf6c42b;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_128._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_110 = (undefined1  [8])&local_3a8;
  local_488._0_8_ = "";
  local_88._8_8_ = local_88._8_8_ & 0xffffffffffffff00;
  local_88._0_8_ = &PTR__lazy_ostream_013ac170;
  local_78._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._8_8_ = local_488;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pbVar6;
  boost::test_tools::tt_detail::report_assertion
            (&local_148,&local_58,1,2,REQUIRE,0xec2d00,(size_t)&local_388,0x59d,local_128,"\"\"",
             local_88);
  boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&result);
  local_128._0_8_ = "--";
  local_128._8_8_ = (pointer)0x2;
  local_88[0] = 0x2d;
  separators_01._M_str = pvVar4;
  separators_01._M_len = (size_t)local_88;
  util::Split<std::__cxx11::string>(&result,(util *)local_128,(Span<const_char> *)0x1,separators_01)
  ;
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x5a3;
  file_04.m_begin = (iterator)&local_1f8;
  msg_04.m_end = pvVar5;
  msg_04.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_208,
             msg_04);
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_48 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_40 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0xf6cf21;
  local_4a8._M_dataplus._M_p =
       (pointer)((long)result.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)result.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
  local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((long)result.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)result.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x60);
  local_4e8._0_4_ = 3;
  local_148.m_message.px = (element_type *)0x0;
  local_148.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_388._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_388.m_message.px = (element_type *)0xf6c42b;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = &local_4a8;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_013abb70;
  local_128._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_110 = (undefined1  [8])&local_3a8;
  local_488._0_8_ = local_4e8;
  local_88._8_8_ = local_88._8_8_ & 0xffffffffffffff00;
  local_88._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_78._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._8_8_ = local_488;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_148,&local_58,1,2,REQUIRE,0xf731c7,(size_t)&local_388,0x5a3,local_128,"3",
             local_88);
  boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x5a4;
  file_05.m_begin = (iterator)&local_218;
  msg_05.m_end = pvVar5;
  msg_05.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_228,
             msg_05);
  pbVar2 = result.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_48 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_40 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0xf6cf21;
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (result.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,"");
  local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == 0);
  local_148.m_message.px = (element_type *)0x0;
  local_148.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_388._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_388.m_message.px = (element_type *)0xf6c42b;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pbVar2;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_128._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_110 = (undefined1  [8])&local_3a8;
  local_488._0_8_ = "";
  local_88._8_8_ = local_88._8_8_ & 0xffffffffffffff00;
  local_88._0_8_ = &PTR__lazy_ostream_013ac170;
  local_78._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._8_8_ = local_488;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_148,&local_58,1,2,REQUIRE,0xec2cf6,(size_t)&local_388,0x5a4,local_128,"\"\"",
             local_88);
  boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x5a5;
  file_06.m_begin = (iterator)&local_238;
  msg_06.m_end = pvVar5;
  msg_06.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_248,
             msg_06);
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_48 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_40 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0xf6cf21;
  pbVar6 = result.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1;
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (pbVar6,"");
  local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == 0);
  local_148.m_message.px = (element_type *)0x0;
  local_148.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_388._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_388.m_message.px = (element_type *)0xf6c42b;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_128._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_110 = (undefined1  [8])&local_3a8;
  local_488._0_8_ = "";
  local_88._8_8_ = local_88._8_8_ & 0xffffffffffffff00;
  local_88._0_8_ = &PTR__lazy_ostream_013ac170;
  local_78._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._8_8_ = local_488;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pbVar6;
  boost::test_tools::tt_detail::report_assertion
            (&local_148,&local_58,1,2,REQUIRE,0xec2d00,(size_t)&local_388,0x5a5,local_128,"\"\"",
             local_88);
  boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x5a6;
  file_07.m_begin = (iterator)&local_258;
  msg_07.m_end = pvVar5;
  msg_07.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_268,
             msg_07);
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_48 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_40 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0xf6cf21;
  pbVar6 = result.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 2;
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (pbVar6,"");
  local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == 0);
  local_148.m_message.px = (element_type *)0x0;
  local_148.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_388._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_388.m_message.px = (element_type *)0xf6c42b;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_128._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_110 = (undefined1  [8])&local_3a8;
  local_488._0_8_ = "";
  local_88._8_8_ = local_88._8_8_ & 0xffffffffffffff00;
  local_88._0_8_ = &PTR__lazy_ostream_013ac170;
  local_78._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._8_8_ = local_488;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pbVar6;
  boost::test_tools::tt_detail::report_assertion
            (&local_148,&local_58,1,2,REQUIRE,0xec2d0a,(size_t)&local_388,0x5a6,local_128,"\"\"",
             local_88);
  boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&result);
  local_128._0_8_ = "abc";
  local_128._8_8_ = (pointer)0x3;
  local_88[0] = 0x2d;
  separators_02._M_str = pvVar4;
  separators_02._M_len = (size_t)local_88;
  util::Split<std::__cxx11::string>(&result,(util *)local_128,(Span<const_char> *)0x1,separators_02)
  ;
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x5ac;
  file_08.m_begin = (iterator)&local_278;
  msg_08.m_end = pvVar5;
  msg_08.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_288,
             msg_08);
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_48 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_40 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0xf6cf21;
  local_4a8._M_dataplus._M_p =
       (pointer)((long)result.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)result.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
  local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((long)result.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)result.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x20);
  local_4e8._0_4_ = 1;
  local_148.m_message.px = (element_type *)0x0;
  local_148.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_388._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_388.m_message.px = (element_type *)0xf6c42b;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = &local_4a8;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_013abb70;
  local_128._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_110 = (undefined1  [8])&local_3a8;
  local_488._0_8_ = local_4e8;
  local_88._8_8_ = local_88._8_8_ & 0xffffffffffffff00;
  local_88._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_78._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._8_8_ = local_488;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_148,&local_58,1,2,REQUIRE,0xf731c7,(size_t)&local_388,0x5ac,(util *)local_128,
             "1",local_88);
  boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x5ad;
  file_09.m_begin = (iterator)&local_298;
  msg_09.m_end = pvVar5;
  msg_09.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_2a8,
             msg_09);
  pbVar2 = result.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_48 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_40 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0xf6cf21;
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (result.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,"abc");
  local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == 0);
  local_148.m_message.px = (element_type *)0x0;
  local_148.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_388._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_388.m_message.px = (element_type *)0xf6c42b;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pbVar2;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_128._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_110 = (undefined1  [8])&local_3a8;
  local_488._0_8_ = "abc";
  local_88._8_8_ = local_88._8_8_ & 0xffffffffffffff00;
  local_88._0_8_ = &PTR__lazy_ostream_013ac330;
  local_78._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._8_8_ = local_488;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_148,&local_58,1,2,REQUIRE,0xec2cf6,(size_t)&local_388,0x5ad,local_128,"\"abc\"",
             local_88);
  boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&result);
  local_128._0_8_ = "a-b";
  local_128._8_8_ = (pointer)0x3;
  local_88[0] = 0x2d;
  separators_03._M_str = pvVar4;
  separators_03._M_len = (size_t)local_88;
  util::Split<std::__cxx11::string>(&result,(util *)local_128,(Span<const_char> *)0x1,separators_03)
  ;
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x5b3;
  file_10.m_begin = (iterator)&local_2b8;
  msg_10.m_end = pvVar5;
  msg_10.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_2c8,
             msg_10);
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_48 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_40 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0xf6cf21;
  local_4a8._M_dataplus._M_p =
       (pointer)((long)result.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)result.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
  local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((long)result.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)result.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x40);
  local_4e8._0_4_ = 2;
  local_148.m_message.px = (element_type *)0x0;
  local_148.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_388._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_388.m_message.px = (element_type *)0xf6c42b;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = &local_4a8;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_013abb70;
  local_128._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_110 = (undefined1  [8])&local_3a8;
  local_488._0_8_ = local_4e8;
  local_88._8_8_ = local_88._8_8_ & 0xffffffffffffff00;
  local_88._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_78._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._8_8_ = local_488;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_148,&local_58,1,2,REQUIRE,0xf731c7,(size_t)&local_388,0x5b3,(util *)local_128,
             "2",local_88);
  boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
  local_2d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x5b4;
  file_11.m_begin = (iterator)&local_2d8;
  msg_11.m_end = pvVar5;
  msg_11.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_2e8,
             msg_11);
  pbVar2 = result.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_48 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_40 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0xf6cf21;
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (result.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,"a");
  local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == 0);
  local_148.m_message.px = (element_type *)0x0;
  local_148.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_388._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_388.m_message.px = (element_type *)0xf6c42b;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pbVar2;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_128._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_110 = (undefined1  [8])&local_3a8;
  local_488._0_8_ = "a";
  local_88._8_8_ = local_88._8_8_ & 0xffffffffffffff00;
  local_88._0_8_ = &PTR__lazy_ostream_013ac2b0;
  local_78._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._8_8_ = local_488;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_148,&local_58,1,2,REQUIRE,0xec2cf6,(size_t)&local_388,0x5b4,local_128,"\"a\"",
             local_88);
  boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x5b5;
  file_12.m_begin = (iterator)&local_2f8;
  msg_12.m_end = pvVar5;
  msg_12.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_308,
             msg_12);
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_48 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_40 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0xf6cf21;
  pbVar6 = result.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1;
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (pbVar6,"b");
  local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == 0);
  local_148.m_message.px = (element_type *)0x0;
  local_148.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_388._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_388.m_message.px = (element_type *)0xf6c42b;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_128._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_110 = (undefined1  [8])&local_3a8;
  local_488._0_8_ = "b";
  local_88._8_8_ = local_88._8_8_ & 0xffffffffffffff00;
  local_88._0_8_ = &PTR__lazy_ostream_013ac2b0;
  local_78._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._8_8_ = local_488;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pbVar6;
  boost::test_tools::tt_detail::report_assertion
            (&local_148,&local_58,1,2,REQUIRE,0xec2d00,(size_t)&local_388,0x5b5,local_128,"\"b\"",
             local_88);
  boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&result);
  local_128._0_8_ = "AAA";
  local_128._8_8_ = (pointer)0x3;
  local_88[0] = 0x61;
  separators_04._M_str = pvVar4;
  separators_04._M_len = (size_t)local_88;
  util::Split<std::__cxx11::string>(&result,(util *)local_128,(Span<const_char> *)0x1,separators_04)
  ;
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x5bb;
  file_13.m_begin = (iterator)&local_318;
  msg_13.m_end = pvVar5;
  msg_13.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_328,
             msg_13);
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_48 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_40 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0xf6cf21;
  local_4a8._M_dataplus._M_p =
       (pointer)((long)result.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)result.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
  local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((long)result.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)result.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x20);
  local_4e8._0_4_ = 1;
  local_148.m_message.px = (element_type *)0x0;
  local_148.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_388._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_388.m_message.px = (element_type *)0xf6c42b;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = &local_4a8;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_013abb70;
  local_128._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_110 = (undefined1  [8])&local_3a8;
  local_488._0_8_ = local_4e8;
  local_88._8_8_ = local_88._8_8_ & 0xffffffffffffff00;
  local_88._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_78._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._8_8_ = local_488;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_148,&local_58,1,2,REQUIRE,0xf731c7,(size_t)&local_388,0x5bb,(util *)local_128,
             "1",local_88);
  boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_330 = "";
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x5bc;
  file_14.m_begin = (iterator)&local_338;
  msg_14.m_end = pvVar5;
  msg_14.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_348,
             msg_14);
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_48 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_40 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0xf6cf21;
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (result.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,"AAA");
  local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar1 == 0);
  local_148.m_message.px = (element_type *)0x0;
  local_148.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_388._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_388.m_message.px = (element_type *)0xf6c42b;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       result.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_128._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_110 = (undefined1  [8])&local_3a8;
  local_488._0_8_ = "AAA";
  local_88._8_8_ = local_88._8_8_ & 0xffffffffffffff00;
  local_88._0_8_ = &PTR__lazy_ostream_013ac330;
  local_78._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._8_8_ = local_488;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_148,&local_58,1,2,REQUIRE,0xec2cf6,(size_t)&local_388,0x5bc,local_128,"\"AAA\"",
             local_88);
  boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&result);
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x5c2;
  file_15.m_begin = (iterator)&local_358;
  msg_15.m_end = pvVar5;
  msg_15.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_368,
             msg_15);
  local_128._0_8_ = "a,b.c:d;e";
  local_128._8_8_ = (pointer)0x9;
  separators_05._M_str = pvVar4;
  separators_05._M_len = (size_t)",;";
  util::Split<std::__cxx11::string>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_388,(util *)local_128,(Span<const_char> *)0x2,separators_05);
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_388._0_8_;
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_388.m_message.px;
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_388.m_message.pn.pi_;
  local_388._0_8_ = (pointer)0x0;
  local_388.m_message.px = (element_type *)0x0;
  local_388.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = local_128 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"a","");
  pbVar2 = (pointer)local_f8;
  apbStack_108[0] = pbVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)apbStack_108,"b.c:d","");
  plVar7 = local_d8;
  local_e8._M_allocated_capacity = (size_type)plVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_f8 + 0x10),"e","");
  __l._M_len = 3;
  __l._M_array = (iterator)local_128;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_3a8,__l,(allocator_type *)&local_4a8);
  local_88._0_8_ =
       result.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_88._8_8_ =
       result.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_78._0_8_ =
       result.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._8_8_ =
       local_3a8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  aStack_68._M_allocated_capacity =
       (size_type)
       local_3a8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  aStack_68._8_8_ =
       local_3a8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _cVar10 = 0x74a93b;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::test_tools::assertion::op::EQ<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>_>
  ::evaluate(&local_148,
             (binary_expr<boost::test_tools::assertion::value_expr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::test_tools::assertion::op::EQ<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>_>
              *)local_88,false);
  local_488._0_8_ = "SplitString(\"a,b.c:d;e\", \",;\") == V({\"a\", \"b.c:d\", \"e\"})";
  local_488._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_48 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_40 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_488;
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_3b0 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0xe;
  boost::test_tools::tt_detail::report_assertion
            (&local_148,&local_58,1,0xe,WARN,_cVar10,(size_t)&local_3b8,0x5c2);
  boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_78 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3a8);
  lVar8 = -0x60;
  do {
    if (plVar7 != (long *)plVar7[-2]) {
      operator_delete((long *)plVar7[-2],*plVar7 + 1);
    }
    plVar7 = plVar7 + -4;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&result);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_388);
  local_3c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_3c0 = "";
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x5c3;
  file_16.m_begin = (iterator)&local_3c8;
  msg_16.m_end = pvVar5;
  msg_16.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_3d8,
             msg_16);
  local_128._0_8_ = "a,b.c:d;e";
  local_128._8_8_ = (pointer)0x9;
  separators_06._M_str = pvVar4;
  separators_06._M_len = (size_t)",;:.";
  util::Split<std::__cxx11::string>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_388,(util *)local_128,(Span<const_char> *)0x4,separators_06);
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_388._0_8_;
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_388.m_message.px;
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_388.m_message.pn.pi_;
  local_388._0_8_ = (pointer)0x0;
  local_388.m_message.px = (element_type *)0x0;
  local_388.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = local_128 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"a","");
  apbStack_108[0] = pbVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)apbStack_108,"b","");
  plVar7 = local_d8;
  local_e8._M_allocated_capacity = (size_type)plVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_f8 + 0x10),"c","");
  plVar3 = local_b8;
  local_c8[0] = plVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"d","");
  plVar9 = local_98;
  local_a8[0] = plVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"e","");
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)local_128;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_3a8,__l_00,(allocator_type *)&local_4a8);
  local_88._0_8_ =
       result.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_88._8_8_ =
       result.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_78._0_8_ =
       result.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._8_8_ =
       local_3a8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  aStack_68._M_allocated_capacity =
       (size_type)
       local_3a8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  aStack_68._8_8_ =
       local_3a8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _cVar10 = 0x74ac3b;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::test_tools::assertion::op::EQ<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>_>
  ::evaluate(&local_148,
             (binary_expr<boost::test_tools::assertion::value_expr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::test_tools::assertion::op::EQ<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>_>
              *)local_88,false);
  local_488._0_8_ = "SplitString(\"a,b.c:d;e\", \",;:.\") == V({\"a\", \"b\", \"c\", \"d\", \"e\"})"
  ;
  local_488._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_48 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_40 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_488;
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_3e0 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0xe;
  boost::test_tools::tt_detail::report_assertion
            (&local_148,&local_58,1,0xe,WARN,_cVar10,(size_t)&local_3e8,0x5c3);
  boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_78 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3a8);
  lVar8 = -0xa0;
  do {
    if (plVar9 != (long *)plVar9[-2]) {
      operator_delete((long *)plVar9[-2],*plVar9 + 1);
    }
    plVar9 = plVar9 + -4;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&result);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_388);
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_3f0 = "";
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x5c4;
  file_17.m_begin = (iterator)&local_3f8;
  msg_17.m_end = pvVar5;
  msg_17.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_408,
             msg_17);
  local_88._0_8_ = "a,b.c:d;e";
  local_88._8_8_ = (pointer)0x9;
  separators_07._M_str = pvVar4;
  separators_07._M_len = (size_t)"";
  util::Split<std::__cxx11::string>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_388,(util *)local_88,(Span<const_char> *)0x0,separators_07);
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_388._0_8_;
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_388.m_message.px;
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_388.m_message.pn.pi_;
  local_388._0_8_ = (pointer)0x0;
  local_388.m_message.px = (element_type *)0x0;
  local_388.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88._0_8_ = (pointer)local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"a,b.c:d;e","");
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_88;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_3a8,__l_01,(allocator_type *)&local_4a8);
  local_128._0_8_ =
       result.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_128._8_8_ =
       result.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_128._16_8_ =
       result.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_110 = (undefined1  [8])
              local_3a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  apbStack_108[0] =
       local_3a8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  apbStack_108[1] =
       local_3a8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _cVar10 = 0x74ae8e;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::test_tools::assertion::op::EQ<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>_>
  ::evaluate(&local_148,
             (binary_expr<boost::test_tools::assertion::value_expr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::test_tools::assertion::op::EQ<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>_>
              *)local_128,false);
  local_488._0_8_ = "SplitString(\"a,b.c:d;e\", \"\") == V({\"a,b.c:d;e\"})";
  local_488._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_48 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_40 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_488;
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_410 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0xe;
  boost::test_tools::tt_detail::report_assertion
            (&local_148,&local_58,1,0xe,WARN,_cVar10,(size_t)&local_418,0x5c4);
  boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_110);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_128);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3a8);
  if ((pointer)local_88._0_8_ != (pointer)local_78) {
    operator_delete((void *)local_88._0_8_,(ulong)(local_78._0_8_ + 1));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&result);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_388);
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x5c5;
  file_18.m_begin = (iterator)&local_428;
  msg_18.m_end = pvVar5;
  msg_18.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_438,
             msg_18);
  local_88._0_8_ = "aaa";
  local_88._8_8_ = (pointer)0x3;
  separators_08._M_str = pvVar4;
  separators_08._M_len = (size_t)"bcdefg";
  util::Split<std::__cxx11::string>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_388,(util *)local_88,(Span<const_char> *)0x6,separators_08);
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_388._0_8_;
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_388.m_message.px;
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_388.m_message.pn.pi_;
  local_388._0_8_ = (pointer)0x0;
  local_388.m_message.px = (element_type *)0x0;
  local_388.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"aaa","");
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)local_88;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_3a8,__l_02,(allocator_type *)&local_4a8);
  local_128._0_8_ =
       result.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_128._8_8_ =
       result.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_128._16_8_ =
       result.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_110 = (undefined1  [8])
              local_3a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  apbStack_108[0] =
       local_3a8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  apbStack_108[1] =
       local_3a8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _cVar10 = 0x74b0df;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::test_tools::assertion::op::EQ<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>_>
  ::evaluate(&local_148,
             (binary_expr<boost::test_tools::assertion::value_expr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::test_tools::assertion::op::EQ<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>_>
              *)local_128,false);
  local_488._0_8_ = "SplitString(\"aaa\", \"bcdefg\") == V({\"aaa\"})";
  local_488._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_48 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_40 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_488;
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_440 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0xe;
  boost::test_tools::tt_detail::report_assertion
            (&local_148,&local_58,1,0xe,WARN,_cVar10,(size_t)&local_448,0x5c5);
  boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_110);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_128);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3a8);
  if ((pointer)local_88._0_8_ != (pointer)local_78) {
    operator_delete((void *)local_88._0_8_,(ulong)(local_78._0_8_ + 1));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&result);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_388);
  local_458 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_450 = "";
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x5c6;
  file_19.m_begin = (iterator)&local_458;
  msg_19.m_end = pvVar5;
  msg_19.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_468,
             msg_19);
  local_128._0_8_ = &local_48;
  local_48 = (_func_int *)CONCAT26(local_48._6_2_,0x622c610078);
  local_58.m_empty = true;
  local_58._9_7_ = 0;
  local_148._0_8_ = &local_148.m_message.pn;
  local_148.m_message.pn.pi_ = local_148.m_message.pn.pi_ & 0xffffffffffff0000;
  local_148.m_message.px = (element_type *)0x1;
  local_128._8_8_ = (pointer)0x5;
  separators_09._M_str = pvVar4;
  separators_09._M_len = local_148._0_8_;
  local_58._vptr_lazy_ostream = (_func_int **)local_128._0_8_;
  util::Split<std::__cxx11::string>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_488,(util *)local_128,(Span<const_char> *)0x1,separators_09);
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_488._0_8_;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_488._8_8_;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_478;
  local_488._0_8_ = (pointer)0x0;
  local_488._8_8_ = (pointer)0x0;
  local_478 = (pointer)0x0;
  local_128._0_8_ = local_128 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"x","");
  apbStack_108[0] = pbVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)apbStack_108,"a,b","");
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)local_128;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_4a8,__l_03,&local_4a9);
  local_88._0_8_ =
       local_3a8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_88._8_8_ =
       local_3a8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_78._0_8_ =
       local_3a8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._8_8_ = local_4a8._M_dataplus._M_p;
  aStack_68._M_allocated_capacity = local_4a8._M_string_length;
  aStack_68._8_8_ = local_4a8.field_2._M_allocated_capacity;
  local_4a8._M_dataplus._M_p = (pointer)0x0;
  local_4a8._M_string_length = 0;
  local_4a8.field_2._M_allocated_capacity = 0;
  _cVar10 = 0x74b39d;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::test_tools::assertion::op::EQ<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>_>
  ::evaluate(&local_388,
             (binary_expr<boost::test_tools::assertion::value_expr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::test_tools::assertion::op::EQ<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>_>
              *)local_88,false);
  local_4e8._0_8_ = "SplitString(\"x\\0a,b\"s, \"\\0\"s) == V({\"x\", \"a,b\"})";
  local_4e8._8_8_ = "";
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)result.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013abc70;
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_4f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_4f0 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0xe;
  boost::test_tools::tt_detail::report_assertion
            (&local_388,(lazy_ostream *)&result,1,0xe,WARN,_cVar10,(size_t)&local_4f8,0x5c6);
  boost::detail::shared_count::~shared_count(&local_388.m_message.pn);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_78 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_4a8);
  lVar8 = -0x40;
  do {
    if (pbVar2 != (pointer)pbVar2[-1].field_2._M_allocated_capacity) {
      operator_delete((pointer)pbVar2[-1].field_2._M_allocated_capacity,
                      (ulong)((pbVar2->_M_dataplus)._M_p + 1));
    }
    pbVar2 = pbVar2 + -1;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_488);
  if ((shared_count *)local_148._0_8_ != &local_148.m_message.pn) {
    operator_delete((void *)local_148._0_8_,
                    (ulong)((long)&(local_148.m_message.pn.pi_)->_vptr_sp_counted_base + 1));
  }
  if (local_58._vptr_lazy_ostream != &local_48) {
    operator_delete(local_58._vptr_lazy_ostream,(ulong)(local_48 + 1));
  }
  local_508 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_500 = "";
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x5c7;
  file_20.m_begin = (iterator)&local_508;
  msg_20.m_end = pvVar5;
  msg_20.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_518,
             msg_20);
  local_48 = (_func_int *)CONCAT26(local_48._6_2_,0x622c610078);
  local_58.m_empty = true;
  local_58._9_7_ = 0;
  local_128._8_8_ = (pointer)0x5;
  local_148._0_8_ = local_148._0_8_ & 0xffffffffffffff00;
  separators_10._M_str = pvVar4;
  separators_10._M_len = (size_t)&local_148;
  local_128._0_8_ = &local_48;
  local_58._vptr_lazy_ostream = &local_48;
  util::Split<std::__cxx11::string>
            (&local_3a8,(util *)local_128,(Span<const_char> *)0x1,separators_10);
  local_388._0_8_ =
       local_3a8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_388.m_message.px =
       (element_type *)
       local_3a8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_388.m_message.pn.pi_ =
       (sp_counted_base *)
       local_3a8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128._0_8_ = local_128 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"x","");
  pbVar2 = (pointer)local_f8;
  apbStack_108[0] = pbVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)apbStack_108,"a,b","");
  __l_04._M_len = 2;
  __l_04._M_array = (iterator)local_128;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_488,__l_04,(allocator_type *)local_4e8);
  local_88._0_8_ = local_388._0_8_;
  local_88._8_8_ = local_388.m_message.px;
  local_78._0_8_ = local_388.m_message.pn.pi_;
  local_388._0_8_ = (pointer)0x0;
  local_388.m_message.px = (element_type *)0x0;
  local_388.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_78._8_8_ = local_488._0_8_;
  aStack_68._M_allocated_capacity = local_488._8_8_;
  aStack_68._8_8_ = local_478;
  local_488._0_8_ = (pointer)0x0;
  local_488._8_8_ = (pointer)0x0;
  local_478 = (pointer)0x0;
  _cVar10 = 0x74b6a5;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::test_tools::assertion::op::EQ<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>_>
  ::evaluate((assertion_result *)&result,
             (binary_expr<boost::test_tools::assertion::value_expr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::test_tools::assertion::op::EQ<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>_>
              *)local_88,false);
  local_4a8._M_dataplus._M_p = "SplitString(\"x\\0a,b\"s, \'\\0\') == V({\"x\", \"a,b\"})";
  local_4a8._M_string_length = 0xf73331;
  local_148.m_message.px = (element_type *)((ulong)local_148.m_message.px & 0xffffffffffffff00);
  local_148._0_8_ = &PTR__lazy_ostream_013abc70;
  local_148.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_528 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_520 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0xe;
  local_130 = &local_4a8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&result,(lazy_ostream *)&local_148,1,0xe,WARN,_cVar10,
             (size_t)&local_528,0x5c7);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &result.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_78 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_488);
  lVar8 = -0x40;
  do {
    if (pbVar2 != (pointer)pbVar2[-1].field_2._M_allocated_capacity) {
      operator_delete((pointer)pbVar2[-1].field_2._M_allocated_capacity,
                      (ulong)((pbVar2->_M_dataplus)._M_p + 1));
    }
    pbVar2 = pbVar2 + -1;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_388);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3a8);
  if (local_58._vptr_lazy_ostream != &local_48) {
    operator_delete(local_58._vptr_lazy_ostream,(ulong)(local_48 + 1));
  }
  local_538 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_530 = "";
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  local_540 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x5c8;
  file_21.m_begin = (iterator)&local_538;
  msg_21.m_end = pvVar5;
  msg_21.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_548,
             msg_21);
  local_48 = (_func_int *)CONCAT26(local_48._6_2_,0x622c610078);
  local_58._8_8_ = 5;
  local_148._0_8_ = &local_148.m_message.pn;
  local_148.m_message.px = (element_type *)0x2;
  local_148.m_message.pn.pi_._0_3_ = 0x2c00;
  local_128._8_8_ = (pointer)0x5;
  separators_11._M_str = pvVar4;
  separators_11._M_len = local_148._0_8_;
  local_128._0_8_ = &local_48;
  local_58._vptr_lazy_ostream = &local_48;
  util::Split<std::__cxx11::string>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_488,(util *)local_128,(Span<const_char> *)0x2,separators_11);
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_488._0_8_;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_488._8_8_;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_478;
  local_488._0_8_ = (pointer)0x0;
  local_488._8_8_ = (pointer)0x0;
  local_478 = (pointer)0x0;
  local_128._0_8_ = local_128 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"x","");
  apbStack_108[0] = (pointer)local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)apbStack_108,"a","");
  local_e8._M_allocated_capacity = (size_type)plVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_f8 + 0x10),"b","");
  __l_05._M_len = 3;
  __l_05._M_array = (iterator)local_128;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_4a8,__l_05,&local_4a9);
  local_88._0_8_ =
       local_3a8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_88._8_8_ =
       local_3a8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_78._0_8_ =
       local_3a8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._8_8_ = local_4a8._M_dataplus._M_p;
  aStack_68._M_allocated_capacity = local_4a8._M_string_length;
  aStack_68._8_8_ = local_4a8.field_2._M_allocated_capacity;
  local_4a8._M_dataplus._M_p = (pointer)0x0;
  local_4a8._M_string_length = 0;
  local_4a8.field_2._M_allocated_capacity = 0;
  _cVar10 = 0x74b9b2;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::test_tools::assertion::op::EQ<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>_>
  ::evaluate(&local_388,
             (binary_expr<boost::test_tools::assertion::value_expr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::test_tools::assertion::op::EQ<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>_>
              *)local_88,false);
  local_4e8._0_8_ = "SplitString(\"x\\0a,b\"s, \"\\0,\"s) == V({\"x\", \"a\", \"b\"})";
  local_4e8._8_8_ = "";
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)result.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013abc70;
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_558 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_550 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0xe;
  boost::test_tools::tt_detail::report_assertion
            (&local_388,(lazy_ostream *)&result,1,0xe,WARN,_cVar10,(size_t)&local_558,0x5c8);
  boost::detail::shared_count::~shared_count(&local_388.m_message.pn);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_78 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_4a8);
  lVar8 = -0x60;
  do {
    if (plVar7 != (long *)plVar7[-2]) {
      operator_delete((long *)plVar7[-2],*plVar7 + 1);
    }
    plVar7 = plVar7 + -4;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_488);
  if ((shared_count *)local_148._0_8_ != &local_148.m_message.pn) {
    operator_delete((void *)local_148._0_8_,
                    (ulong)((long)&(local_148.m_message.pn.pi_)->_vptr_sp_counted_base + 1));
  }
  if (local_58._vptr_lazy_ostream != &local_48) {
    operator_delete(local_58._vptr_lazy_ostream,(ulong)(local_48 + 1));
  }
  local_568 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_560 = "";
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x5c9;
  file_22.m_begin = (iterator)&local_568;
  msg_22.m_end = pvVar5;
  msg_22.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_578,
             msg_22);
  local_128._0_8_ = "abcdefg";
  local_128._8_8_ = (pointer)0x7;
  separators_12._M_str = pvVar4;
  separators_12._M_len = (size_t)"bcd";
  util::Split<std::__cxx11::string>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_388,(util *)local_128,(Span<const_char> *)0x3,separators_12);
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_388._0_8_;
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_388.m_message.px;
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_388.m_message.pn.pi_;
  local_388._0_8_ = (pointer)0x0;
  local_388.m_message.px = (element_type *)0x0;
  local_388.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = local_128 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"a","");
  apbStack_108[0] = (pointer)local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)apbStack_108,"");
  local_e8._M_allocated_capacity = (size_type)local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_f8 + 0x10),"");
  local_c8[0] = plVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"efg","");
  __l_06._M_len = 4;
  __l_06._M_array = (iterator)local_128;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_3a8,__l_06,(allocator_type *)&local_4a8);
  local_88._0_8_ =
       result.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_88._8_8_ =
       result.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_78._0_8_ =
       result.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._8_8_ =
       local_3a8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  aStack_68._M_allocated_capacity =
       (size_type)
       local_3a8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  aStack_68._8_8_ =
       local_3a8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _cVar10 = 0x74bccb;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::test_tools::assertion::op::EQ<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>_>
  ::evaluate(&local_148,
             (binary_expr<boost::test_tools::assertion::value_expr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::test_tools::assertion::op::EQ<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>_>
              *)local_88,false);
  local_488._0_8_ = "SplitString(\"abcdefg\", \"bcd\") == V({\"a\", \"\", \"\", \"efg\"})";
  local_488._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_48 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_588 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_580 = "";
  local_40 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_488;
  boost::test_tools::tt_detail::report_assertion
            (&local_148,&local_58,1,0xe,WARN,_cVar10,(size_t)&local_588,0x5c9);
  boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_78 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3a8);
  lVar8 = -0x80;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    plVar3 = plVar3 + -4;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&result);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_388);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_SplitString)
{
    // Empty string.
    {
        std::vector<std::string> result = SplitString("", '-');
        BOOST_CHECK_EQUAL(result.size(), 1);
        BOOST_CHECK_EQUAL(result[0], "");
    }

    // Empty items.
    {
        std::vector<std::string> result = SplitString("-", '-');
        BOOST_CHECK_EQUAL(result.size(), 2);
        BOOST_CHECK_EQUAL(result[0], "");
        BOOST_CHECK_EQUAL(result[1], "");
    }

    // More empty items.
    {
        std::vector<std::string> result = SplitString("--", '-');
        BOOST_CHECK_EQUAL(result.size(), 3);
        BOOST_CHECK_EQUAL(result[0], "");
        BOOST_CHECK_EQUAL(result[1], "");
        BOOST_CHECK_EQUAL(result[2], "");
    }

    // Separator is not present.
    {
        std::vector<std::string> result = SplitString("abc", '-');
        BOOST_CHECK_EQUAL(result.size(), 1);
        BOOST_CHECK_EQUAL(result[0], "abc");
    }

    // Basic behavior.
    {
        std::vector<std::string> result = SplitString("a-b", '-');
        BOOST_CHECK_EQUAL(result.size(), 2);
        BOOST_CHECK_EQUAL(result[0], "a");
        BOOST_CHECK_EQUAL(result[1], "b");
    }

    // Case-sensitivity of the separator.
    {
        std::vector<std::string> result = SplitString("AAA", 'a');
        BOOST_CHECK_EQUAL(result.size(), 1);
        BOOST_CHECK_EQUAL(result[0], "AAA");
    }

    // multiple split characters
    {
        using V = std::vector<std::string>;
        BOOST_TEST(SplitString("a,b.c:d;e", ",;") == V({"a", "b.c:d", "e"}));
        BOOST_TEST(SplitString("a,b.c:d;e", ",;:.") == V({"a", "b", "c", "d", "e"}));
        BOOST_TEST(SplitString("a,b.c:d;e", "") == V({"a,b.c:d;e"}));
        BOOST_TEST(SplitString("aaa", "bcdefg") == V({"aaa"}));
        BOOST_TEST(SplitString("x\0a,b"s, "\0"s) == V({"x", "a,b"}));
        BOOST_TEST(SplitString("x\0a,b"s, '\0') == V({"x", "a,b"}));
        BOOST_TEST(SplitString("x\0a,b"s, "\0,"s) == V({"x", "a", "b"}));
        BOOST_TEST(SplitString("abcdefg", "bcd") == V({"a", "", "", "efg"}));
    }
}